

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_fixed_suite::fixed_ctor_const_array(void)

{
  bool bVar1;
  undefined4 local_54;
  size_type local_50;
  undefined4 local_44;
  size_type local_40 [2];
  undefined1 local_30 [8];
  circular_view<const_int,_4UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<const_int,_4UL>::circular_view<4UL,_0>
            ((circular_view<const_int,_4UL> *)local_30,(value_type (*) [4])&span.member.next);
  bVar1 = vista::circular_view<const_int,_4UL>::empty((circular_view<const_int,_4UL> *)local_30);
  boost::detail::test_impl
            ("span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x30e,"void api_fixed_suite::fixed_ctor_const_array()",bVar1);
  bVar1 = vista::circular_view<const_int,_4UL>::full((circular_view<const_int,_4UL> *)local_30);
  boost::detail::test_impl
            ("!span.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x30f,"void api_fixed_suite::fixed_ctor_const_array()",(bool)(bVar1 - 1U & 1));
  local_40[0] = vista::circular_view<const_int,_4UL>::size
                          ((circular_view<const_int,_4UL> *)local_30);
  local_44 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x310,"void api_fixed_suite::fixed_ctor_const_array()",local_40,&local_44);
  local_50 = vista::circular_view<const_int,_4UL>::capacity
                       ((circular_view<const_int,_4UL> *)local_30);
  local_54 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x311,"void api_fixed_suite::fixed_ctor_const_array()",&local_50,&local_54);
  return;
}

Assistant:

void fixed_ctor_const_array()
{
    int array[4] = {};
    circular_view<const int, 4> span(array);
    BOOST_TEST(span.empty());
    BOOST_TEST(!span.full());
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.capacity(), 4);
}